

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::parseQuadrupole
          (MultipoleAtomTypesSectionParser *this,StringTokenizer *tokenizer,
          Vector3d *quadrupoleMoments,int lineNo)

{
  int iVar1;
  RealType RVar2;
  
  iVar1 = StringTokenizer::countTokens(tokenizer);
  if (2 < iVar1) {
    RVar2 = StringTokenizer::nextTokenAsDouble(tokenizer);
    (quadrupoleMoments->super_Vector<double,_3U>).data_[0] = RVar2;
    RVar2 = StringTokenizer::nextTokenAsDouble(tokenizer);
    (quadrupoleMoments->super_Vector<double,_3U>).data_[1] = RVar2;
    RVar2 = StringTokenizer::nextTokenAsDouble(tokenizer);
    (quadrupoleMoments->super_Vector<double,_3U>).data_[2] = RVar2;
    return;
  }
  snprintf(painCave.errMsg,2000,
           "MultipoleAtomTypesSectionParser Error: Not enough tokens at line %d\n",
           (ulong)(uint)lineNo);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void MultipoleAtomTypesSectionParser::parseQuadrupole(
      StringTokenizer& tokenizer, Vector3d& quadrupoleMoments, int lineNo) {
    int nTokens = tokenizer.countTokens();
    if (nTokens >= 3) {
      quadrupoleMoments[0] = tokenizer.nextTokenAsDouble();
      quadrupoleMoments[1] = tokenizer.nextTokenAsDouble();
      quadrupoleMoments[2] = tokenizer.nextTokenAsDouble();

      // RealType trace =  quadrupoleMoments.sum();
      //
      // if (fabs(trace) > OpenMD::epsilon) {
      //   snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //   "MultipoleAtomTypesSectionParser Error: the trace of quadrupole
      //   moments is not zero at line %d\n", 	lineNo); painCave.isFatal = 1;
      //   simError();
      // }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }